

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O0

Lpk_Res_t * Lpk_DsdAnalize(Lpk_Man_t *pMan,Lpk_Fun_t *p,int nShared)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  Vec_Int_t *vBSets_00;
  uint *pIn;
  int local_84;
  char local_7d;
  int i;
  Kit_DsdNtk_t *pKStack_78;
  char pCofVars [5];
  Kit_DsdNtk_t *pNtks [8];
  Vec_Int_t *vBSets;
  Lpk_Res_t *pRes;
  int fUseBackLooking;
  int nShared_local;
  Lpk_Fun_t *p_local;
  Lpk_Man_t *pMan_local;
  
  vBSets = (Vec_Int_t *)0x0;
  memset(&stack0xffffffffffffff88,0,0x40);
  if ((*(uint *)&p->field_0x8 >> 0xc & 0xf) < 3) {
    __assert_fail("p->nLutK >= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcDsd.c"
                  ,0x1d1,"Lpk_Res_t *Lpk_DsdAnalize(Lpk_Man_t *, Lpk_Fun_t *, int)");
  }
  if ((nShared < 0) || (3 < nShared)) {
    __assert_fail("nShared >= 0 && nShared <= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcDsd.c"
                  ,0x1d2,"Lpk_Res_t *Lpk_DsdAnalize(Lpk_Man_t *, Lpk_Fun_t *, int)");
  }
  uVar3 = p->uSupp;
  uVar1 = Kit_BitMask(*(uint *)&p->field_0x8 >> 7 & 0x1f);
  if (uVar3 != uVar1) {
    __assert_fail("p->uSupp == Kit_BitMask(p->nVars)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcDsd.c"
                  ,0x1d3,"Lpk_Res_t *Lpk_DsdAnalize(Lpk_Man_t *, Lpk_Fun_t *, int)");
  }
  puVar4 = Lpk_FunTruth(p,0);
  pKStack_78 = Kit_DsdDecomposeExpand(puVar4,*(uint *)&p->field_0x8 >> 7 & 0x1f);
  if (pMan->pPars->fVerbose != 0) {
    iVar2 = Kit_DsdNonDsdSizeMax(pKStack_78);
    pMan->nBlocks[iVar2] = pMan->nBlocks[iVar2] + 1;
  }
  vBSets_00 = Lpk_ComputeBoundSets(pKStack_78,*(uint *)&p->field_0x8 >> 0xc & 0xf);
  uVar3 = Lpk_DsdLateArriving(p);
  Lpk_FunCompareBoundSets(p,vBSets_00,0,0xffff,uVar3,Lpk_DsdAnalize::pRes0);
  Vec_IntFree(vBSets_00);
  if (Lpk_DsdAnalize::pRes0->nBSVars == (*(uint *)&p->field_0x8 >> 0xc & 0xf)) {
    vBSets = (Vec_Int_t *)Lpk_DsdAnalize::pRes0;
  }
  else if (Lpk_DsdAnalize::pRes0->nBSVars == (*(uint *)&p->field_0x8 >> 0xc & 0xf) - 1) {
    vBSets = (Vec_Int_t *)Lpk_DsdAnalize::pRes0;
  }
  else if (nShared != 0) {
    puVar4 = pMan->ppTruths[0][0];
    pIn = Lpk_FunTruth(p,0);
    Kit_TruthCopy(puVar4,pIn,*(uint *)&p->field_0x8 >> 7 & 0x1f);
    iVar2 = Lpk_DsdAnalizeOne(p,pMan->ppTruths,&stack0xffffffffffffff88,&local_7d,1,
                              Lpk_DsdAnalize::pRes1);
    if (iVar2 != 0) {
      if ((int)((*(uint *)&p->field_0x8 >> 0xc & 0xf) - 1) < Lpk_DsdAnalize::pRes1->nBSVars) {
        __assert_fail("pRes1->nBSVars <= (int)p->nLutK - 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcDsd.c"
                      ,0x1eb,"Lpk_Res_t *Lpk_DsdAnalize(Lpk_Man_t *, Lpk_Fun_t *, int)");
      }
      if (Lpk_DsdAnalize::pRes1->nBSVars == (*(uint *)&p->field_0x8 >> 0xc & 0xf) - 1) {
        vBSets = (Vec_Int_t *)Lpk_DsdAnalize::pRes1;
      }
      else if (Lpk_DsdAnalize::pRes0->nBSVars == (*(uint *)&p->field_0x8 >> 0xc & 0xf) - 2) {
        vBSets = (Vec_Int_t *)Lpk_DsdAnalize::pRes0;
      }
      else if (Lpk_DsdAnalize::pRes1->nBSVars == (*(uint *)&p->field_0x8 >> 0xc & 0xf) - 2) {
        vBSets = (Vec_Int_t *)Lpk_DsdAnalize::pRes1;
      }
      else if (nShared != 1) {
        if (3 < (*(uint *)&p->field_0x8 >> 0xc & 0xf)) {
          iVar2 = Lpk_DsdAnalizeOne(p,pMan->ppTruths,&stack0xffffffffffffff88,&local_7d,2,
                                    Lpk_DsdAnalize::pRes2);
          if (iVar2 == 0) goto LAB_005cd087;
          if ((int)((*(uint *)&p->field_0x8 >> 0xc & 0xf) - 2) < Lpk_DsdAnalize::pRes2->nBSVars) {
            __assert_fail("pRes2->nBSVars <= (int)p->nLutK - 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcDsd.c"
                          ,0x1fa,"Lpk_Res_t *Lpk_DsdAnalize(Lpk_Man_t *, Lpk_Fun_t *, int)");
          }
          if (Lpk_DsdAnalize::pRes2->nBSVars == (*(uint *)&p->field_0x8 >> 0xc & 0xf) - 2) {
            vBSets = (Vec_Int_t *)Lpk_DsdAnalize::pRes2;
            goto LAB_005cd087;
          }
          if (Lpk_DsdAnalize::pRes0->nBSVars == (*(uint *)&p->field_0x8 >> 0xc & 0xf) - 3) {
            vBSets = (Vec_Int_t *)Lpk_DsdAnalize::pRes0;
            goto LAB_005cd087;
          }
          if (Lpk_DsdAnalize::pRes1->nBSVars == (*(uint *)&p->field_0x8 >> 0xc & 0xf) - 3) {
            vBSets = (Vec_Int_t *)Lpk_DsdAnalize::pRes1;
            goto LAB_005cd087;
          }
          if (Lpk_DsdAnalize::pRes2->nBSVars == (*(uint *)&p->field_0x8 >> 0xc & 0xf) - 3) {
            vBSets = (Vec_Int_t *)Lpk_DsdAnalize::pRes2;
            goto LAB_005cd087;
          }
          if (nShared == 2) goto LAB_005cd087;
          if (nShared != 3) {
            __assert_fail("nShared == 3",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcDsd.c"
                          ,0x208,"Lpk_Res_t *Lpk_DsdAnalize(Lpk_Man_t *, Lpk_Fun_t *, int)");
          }
        }
        if ((4 < (*(uint *)&p->field_0x8 >> 0xc & 0xf)) &&
           (iVar2 = Lpk_DsdAnalizeOne(p,pMan->ppTruths,&stack0xffffffffffffff88,&local_7d,3,
                                      Lpk_DsdAnalize::pRes3), iVar2 != 0)) {
          if ((int)((*(uint *)&p->field_0x8 >> 0xc & 0xf) - 3) < Lpk_DsdAnalize::pRes3->nBSVars) {
            __assert_fail("pRes3->nBSVars <= (int)p->nLutK - 3",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkAbcDsd.c"
                          ,0x210,"Lpk_Res_t *Lpk_DsdAnalize(Lpk_Man_t *, Lpk_Fun_t *, int)");
          }
          if (Lpk_DsdAnalize::pRes3->nBSVars == (*(uint *)&p->field_0x8 >> 0xc & 0xf) - 3) {
            vBSets = (Vec_Int_t *)Lpk_DsdAnalize::pRes3;
          }
          else if (Lpk_DsdAnalize::pRes0->nBSVars == (*(uint *)&p->field_0x8 >> 0xc & 0xf) - 4) {
            vBSets = (Vec_Int_t *)Lpk_DsdAnalize::pRes0;
          }
          else if (Lpk_DsdAnalize::pRes1->nBSVars == (*(uint *)&p->field_0x8 >> 0xc & 0xf) - 4) {
            vBSets = (Vec_Int_t *)Lpk_DsdAnalize::pRes1;
          }
          else if (Lpk_DsdAnalize::pRes2->nBSVars == (*(uint *)&p->field_0x8 >> 0xc & 0xf) - 4) {
            vBSets = (Vec_Int_t *)Lpk_DsdAnalize::pRes2;
          }
          else if (Lpk_DsdAnalize::pRes3->nBSVars == (*(uint *)&p->field_0x8 >> 0xc & 0xf) - 4) {
            vBSets = (Vec_Int_t *)Lpk_DsdAnalize::pRes3;
          }
        }
      }
    }
  }
LAB_005cd087:
  for (local_84 = 0; local_84 < 1 << ((byte)nShared & 0x1f); local_84 = local_84 + 1) {
    if (pNtks[(long)local_84 + -1] != (Kit_DsdNtk_t *)0x0) {
      Kit_DsdNtkFree(pNtks[(long)local_84 + -1]);
    }
  }
  return (Lpk_Res_t *)vBSets;
}

Assistant:

Lpk_Res_t * Lpk_DsdAnalize( Lpk_Man_t * pMan, Lpk_Fun_t * p, int nShared )
{ 
    static Lpk_Res_t Res0, * pRes0 = &Res0;
    static Lpk_Res_t Res1, * pRes1 = &Res1;
    static Lpk_Res_t Res2, * pRes2 = &Res2;
    static Lpk_Res_t Res3, * pRes3 = &Res3;
    int fUseBackLooking = 1;
    Lpk_Res_t * pRes = NULL;
    Vec_Int_t * vBSets;
    Kit_DsdNtk_t * pNtks[8] = {NULL};
    char pCofVars[5];
    int i;

    assert( p->nLutK >= 3 );
    assert( nShared >= 0 && nShared <= 3 );
    assert( p->uSupp == Kit_BitMask(p->nVars) );

    // try decomposition without cofactoring
    pNtks[0] = Kit_DsdDecomposeExpand( Lpk_FunTruth( p, 0 ), p->nVars );
    if ( pMan->pPars->fVerbose )
        pMan->nBlocks[ Kit_DsdNonDsdSizeMax(pNtks[0]) ]++;
    vBSets = Lpk_ComputeBoundSets( pNtks[0], p->nLutK );
    Lpk_FunCompareBoundSets( p, vBSets, 0, 0xFFFF, Lpk_DsdLateArriving(p), pRes0 );
    Vec_IntFree( vBSets );

    // check the result
    if ( pRes0->nBSVars == (int)p->nLutK )
        { pRes = pRes0; goto finish; }
    if ( pRes0->nBSVars == (int)p->nLutK - 1 )
        { pRes = pRes0; goto finish; }
    if ( nShared == 0 )
        goto finish;

    // prepare storage
    Kit_TruthCopy( pMan->ppTruths[0][0], Lpk_FunTruth( p, 0 ), p->nVars );

    // cofactor 1 time
    if ( !Lpk_DsdAnalizeOne( p, pMan->ppTruths, pNtks, pCofVars, 1, pRes1 ) )
        goto finish;
    assert( pRes1->nBSVars <= (int)p->nLutK - 1 );
    if ( pRes1->nBSVars == (int)p->nLutK - 1 )
        { pRes = pRes1; goto finish; }
    if ( pRes0->nBSVars == (int)p->nLutK - 2 )
        { pRes = pRes0; goto finish; }
    if ( pRes1->nBSVars == (int)p->nLutK - 2 )
        { pRes = pRes1; goto finish; }
    if ( nShared == 1 )
        goto finish;

    // cofactor 2 times
    if ( p->nLutK >= 4 ) 
    {
        if ( !Lpk_DsdAnalizeOne( p, pMan->ppTruths, pNtks, pCofVars, 2, pRes2 ) )
            goto finish;
        assert( pRes2->nBSVars <= (int)p->nLutK - 2 );
        if ( pRes2->nBSVars == (int)p->nLutK - 2 )
            { pRes = pRes2; goto finish; }
        if ( fUseBackLooking )
        {
            if ( pRes0->nBSVars == (int)p->nLutK - 3 )
                { pRes = pRes0; goto finish; }
            if ( pRes1->nBSVars == (int)p->nLutK - 3 )
                { pRes = pRes1; goto finish; }
        }
        if ( pRes2->nBSVars == (int)p->nLutK - 3 )
            { pRes = pRes2; goto finish; }
        if ( nShared == 2 )
            goto finish;
        assert( nShared == 3 );
    }

    // cofactor 3 times
    if ( p->nLutK >= 5 ) 
    {
        if ( !Lpk_DsdAnalizeOne( p, pMan->ppTruths, pNtks, pCofVars, 3, pRes3 ) )
            goto finish;
        assert( pRes3->nBSVars <= (int)p->nLutK - 3 );
        if ( pRes3->nBSVars == (int)p->nLutK - 3 )
            { pRes = pRes3; goto finish; }
        if ( fUseBackLooking )
        {
            if ( pRes0->nBSVars == (int)p->nLutK - 4 )
                { pRes = pRes0; goto finish; }
            if ( pRes1->nBSVars == (int)p->nLutK - 4 )
                { pRes = pRes1; goto finish; }
            if ( pRes2->nBSVars == (int)p->nLutK - 4 )
                { pRes = pRes2; goto finish; }
        }
        if ( pRes3->nBSVars == (int)p->nLutK - 4 )
            { pRes = pRes3; goto finish; }
    }

finish:
    // free the networks
    for ( i = 0; i < (1<<nShared); i++ )
        if ( pNtks[i] )
            Kit_DsdNtkFree( pNtks[i] );
    // choose the best under these conditions
    return pRes;
}